

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O0

MouseEventResult __thiscall
QMenuSloppyState::processMouseEvent
          (QMenuSloppyState *this,QPointF *mousePos,QAction *resetAction,QAction *currentAction)

{
  QPointF value;
  bool bVar1;
  bool bVar2;
  int iVar3;
  LayoutDirection LVar4;
  ulong uVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  QAction *pQVar8;
  QWidget *this_00;
  QAction *in_RCX;
  QAction *in_RDX;
  QPointF *in_RSI;
  QMenuSloppyState *in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  qreal qVar10;
  qreal newS;
  qreal newS_00;
  qreal qVar11;
  int mouseDir;
  bool rightDirection;
  bool slopeBottom;
  bool slopeTop;
  qreal current_slope_bottom;
  qreal current_slope_top;
  qreal prev_slope_bottom;
  qreal prev_slope_top;
  bool left_to_right;
  int originIdx;
  int resetIdx;
  QPoint sub_menu_bottom;
  QPoint sub_menu_top;
  QRect sub_menu_rect;
  QList<QAction_*> actions;
  QSetValueOnDestroy<QPointF> setPreviousPoint;
  QSetValueOnDestroy<bool> setFirstMouse;
  undefined4 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  QMenuSloppyState *in_stack_fffffffffffffe70;
  QPointF *this_01;
  QWidget *in_stack_fffffffffffffe78;
  QPointF *p2;
  QPointF *in_stack_fffffffffffffe80;
  QPointF *p1;
  bool local_11b;
  MouseEventResult local_cc;
  int local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  qreal local_48;
  qreal local_40;
  QSetValueOnDestroy<QPointF> local_38;
  QAction *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDX;
  if (in_RDI->m_parent != (QMenuSloppyState *)0x0) {
    stopTimer((QMenuSloppyState *)0x651f4e);
  }
  if ((in_RDI->field_0x6c & 1) == 0) {
    local_cc = EventShouldBePropagated;
    goto LAB_00652672;
  }
  startTimerIfNotRunning(in_stack_fffffffffffffe70);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x651f84);
  if (!bVar1) {
    reset((QMenuSloppyState *)
          CONCAT17(in_stack_fffffffffffffe6f,
                   CONCAT16(in_stack_fffffffffffffe6e,
                            CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))));
    local_cc = EventShouldBePropagated;
    goto LAB_00652672;
  }
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSetValueOnDestroy<bool>::QSetValueOnDestroy
            ((QSetValueOnDestroy<bool> *)local_18,&in_RDI->m_first_mouse,false);
  local_38.toSet = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value.xp = -NAN;
  local_38.value.yp = -NAN;
  local_48 = in_RSI->xp;
  local_40 = in_RSI->yp;
  value.yp = (qreal)in_stack_fffffffffffffe78;
  value.xp = (qreal)in_stack_fffffffffffffe70;
  QSetValueOnDestroy<QPointF>::QSetValueOnDestroy
            ((QSetValueOnDestroy<QPointF> *)
             CONCAT17(in_stack_fffffffffffffe6f,
                      CONCAT16(in_stack_fffffffffffffe6e,
                               CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))),
             (QPointF *)0x65204c,value);
  if ((local_20 == (QAction *)0x0) || (uVar5 = QAction::isSeparator(), (uVar5 & 1) == 0)) {
    if (in_RDI->m_reset_action != local_20) {
      if ((((byte)in_RDI->field_0x6c >> 5 & 1) != 0) && (local_20 != (QAction *)0x0)) {
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        QWidget::actions(in_stack_fffffffffffffe78);
        qVar6 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                          ((QListSpecialMethodsBase<QAction_*> *)in_stack_fffffffffffffe70,
                           (QAction **)
                           CONCAT17(in_stack_fffffffffffffe6f,
                                    CONCAT16(in_stack_fffffffffffffe6e,
                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                      in_stack_fffffffffffffe68))),0x65211e);
        qVar7 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                          ((QListSpecialMethodsBase<QAction_*> *)in_stack_fffffffffffffe70,
                           (QAction **)
                           CONCAT17(in_stack_fffffffffffffe6f,
                                    CONCAT16(in_stack_fffffffffffffe6e,
                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                      in_stack_fffffffffffffe68))),0x65213f);
        bVar1 = false;
        if ((-1 < (int)qVar6) && (bVar1 = false, -1 < (int)qVar7)) {
          local_64 = (int)qVar6 - (int)qVar7;
          iVar3 = qAbs<int>(&local_64);
          bVar1 = 1 < iVar3;
        }
        if (bVar1) {
          in_RDI->field_0x6c = in_RDI->field_0x6c & 0xdf;
        }
        QList<QAction_*>::~QList((QList<QAction_*> *)0x6521ba);
      }
      in_RDI->m_reset_action = local_20;
    }
  }
  else {
    in_RDI->m_reset_action = (QAction *)0x0;
    in_RDI->field_0x6c = in_RDI->field_0x6c & 0xdf | 0x20;
  }
  uVar5 = QRectF::contains((QPointF *)&in_RDI->m_action_rect);
  if ((uVar5 & 1) == 0) {
    if (((((byte)in_RDI->field_0x6c >> 1 & 1) != 0) && ((in_RDI->m_first_mouse & 1U) == 0)) &&
       (local_20 != in_RDI->m_origin_action)) {
      LVar4 = QWidget::layoutDirection((QWidget *)0x652280);
      this_00 = &QPointer<QMenu>::operator->((QPointer<QMenu> *)0x6522bb)->super_QWidget;
      QWidget::geometry(this_00);
      if (LVar4 == LeftToRight) {
        QRect::topLeft((QRect *)CONCAT17(in_stack_fffffffffffffe6f,
                                         CONCAT16(in_stack_fffffffffffffe6e,
                                                  CONCAT24(in_stack_fffffffffffffe6c,
                                                           in_stack_fffffffffffffe68))));
        QRect::bottomLeft((QRect *)CONCAT17(in_stack_fffffffffffffe6f,
                                            CONCAT16(in_stack_fffffffffffffe6e,
                                                     CONCAT24(in_stack_fffffffffffffe6c,
                                                              in_stack_fffffffffffffe68))));
      }
      else {
        QRect::topRight((QRect *)CONCAT17(in_stack_fffffffffffffe6f,
                                          CONCAT16(in_stack_fffffffffffffe6e,
                                                   CONCAT24(in_stack_fffffffffffffe6c,
                                                            in_stack_fffffffffffffe68))));
        QRect::bottomRight((QRect *)CONCAT17(in_stack_fffffffffffffe6f,
                                             CONCAT16(in_stack_fffffffffffffe6e,
                                                      CONCAT24(in_stack_fffffffffffffe6c,
                                                               in_stack_fffffffffffffe68))));
      }
      this_01 = &in_RDI->m_previous_point;
      QPointF::QPointF(this_01,(QPoint *)
                               CONCAT17(in_stack_fffffffffffffe6f,
                                        CONCAT16(in_stack_fffffffffffffe6e,
                                                 CONCAT24(in_stack_fffffffffffffe6c,
                                                          in_stack_fffffffffffffe68))));
      qVar9 = slope(in_stack_fffffffffffffe80,(QPointF *)in_stack_fffffffffffffe78);
      p2 = &in_RDI->m_previous_point;
      QPointF::QPointF(this_01,(QPoint *)
                               CONCAT17(in_stack_fffffffffffffe6f,
                                        CONCAT16(in_stack_fffffffffffffe6e,
                                                 CONCAT24(in_stack_fffffffffffffe6c,
                                                          in_stack_fffffffffffffe68))));
      qVar10 = slope(in_stack_fffffffffffffe80,p2);
      p1 = in_RSI;
      QPointF::QPointF(this_01,(QPoint *)
                               CONCAT17(in_stack_fffffffffffffe6f,
                                        CONCAT16(in_stack_fffffffffffffe6e,
                                                 CONCAT24(in_stack_fffffffffffffe6c,
                                                          in_stack_fffffffffffffe68))));
      newS = slope(p1,p2);
      QPointF::QPointF(this_01,(QPoint *)
                               CONCAT17(in_stack_fffffffffffffe6f,
                                        CONCAT16(in_stack_fffffffffffffe6e,
                                                 CONCAT24(in_stack_fffffffffffffe6c,
                                                          in_stack_fffffffffffffe68))));
      newS_00 = slope(p1,p2);
      iVar3 = QPoint::y((QPoint *)0x652485);
      qVar11 = QPointF::y(in_RSI);
      bVar1 = checkSlope(in_RDI,qVar9,newS,(double)iVar3 < qVar11);
      iVar3 = QPoint::y((QPoint *)0x6524f9);
      qVar9 = QPointF::y(in_RSI);
      bVar2 = checkSlope(in_RDI,qVar10,newS_00,qVar9 < (double)iVar3);
      local_11b = false;
      qVar9 = QPointF::y(&in_RDI->m_previous_point);
      qVar10 = QPointF::y(in_RSI);
      if (-1 < (int)(qVar9 - qVar10)) {
        local_11b = bVar1;
      }
      if (((int)(qVar9 - qVar10) < 1) && (bVar1 = local_11b == false, local_11b = true, bVar1)) {
        local_11b = bVar2;
      }
      if ((in_RDI->m_uni_dir_fail_at_count <= in_RDI->m_uni_dir_discarded_count) &&
         (local_11b == false)) {
        in_RDI->m_uni_dir_discarded_count = 0;
        local_cc = EventDiscardsSloppyState;
        goto LAB_00652658;
      }
      if (local_11b == false) {
        in_RDI->m_uni_dir_discarded_count = in_RDI->m_uni_dir_discarded_count + 1;
      }
      else {
        in_RDI->m_uni_dir_discarded_count = 0;
      }
    }
    local_cc = (MouseEventResult)(((byte)in_RDI->field_0x6c >> 2 & 1) != 0);
  }
  else {
    startTimer(in_stack_fffffffffffffe70);
    pQVar8 = QMenu::menuAction((QMenu *)0x65220d);
    local_cc = (MouseEventResult)(in_RCX != pQVar8);
  }
LAB_00652658:
  QSetValueOnDestroy<QPointF>::~QSetValueOnDestroy(&local_38);
  QSetValueOnDestroy<bool>::~QSetValueOnDestroy((QSetValueOnDestroy<bool> *)local_18);
LAB_00652672:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_cc;
}

Assistant:

MouseEventResult processMouseEvent(const QPointF &mousePos, QAction *resetAction, QAction *currentAction)
    {
        if (m_parent)
            m_parent->stopTimer();

        if (!m_enabled)
            return EventShouldBePropagated;

        startTimerIfNotRunning();

        if (!m_sub_menu) {
            reset();
            return EventShouldBePropagated;
        }

        QSetValueOnDestroy<bool> setFirstMouse(m_first_mouse, false);
        QSetValueOnDestroy<QPointF> setPreviousPoint(m_previous_point, mousePos);

        if (resetAction && resetAction->isSeparator()) {
            m_reset_action = nullptr;
            m_use_reset_action = true;
        } else if (m_reset_action != resetAction) {
            if (m_use_reset_action && resetAction) {
                const QList<QAction *> actions = m_menu->actions();
                const int resetIdx  = actions.indexOf(resetAction);
                const int originIdx = actions.indexOf(m_origin_action);
                if (resetIdx > -1 && originIdx > -1 && qAbs(resetIdx - originIdx) > 1)
                    m_use_reset_action = false;
            }
            m_reset_action = resetAction;
        }

        if (m_action_rect.contains(mousePos)) {
            startTimer();
            return currentAction == m_menu->menuAction() ? EventIsProcessed : EventShouldBePropagated;
        }

        if (m_uni_directional && !m_first_mouse && resetAction != m_origin_action) {
            bool left_to_right = m_menu->layoutDirection() == Qt::LeftToRight;
            QRect sub_menu_rect = m_sub_menu->geometry();
            QPoint sub_menu_top =
                    left_to_right? sub_menu_rect.topLeft() : sub_menu_rect.topRight();
            QPoint sub_menu_bottom =
                    left_to_right? sub_menu_rect.bottomLeft() : sub_menu_rect.bottomRight();
            qreal prev_slope_top = slope(m_previous_point, sub_menu_top);
            qreal prev_slope_bottom = slope(m_previous_point, sub_menu_bottom);

            qreal current_slope_top = slope(mousePos, sub_menu_top);
            qreal current_slope_bottom = slope(mousePos, sub_menu_bottom);

            bool slopeTop = checkSlope(prev_slope_top, current_slope_top, sub_menu_top.y() < mousePos.y());
            bool slopeBottom = checkSlope(prev_slope_bottom, current_slope_bottom, sub_menu_bottom.y() > mousePos.y());
            bool rightDirection = false;
            int mouseDir = int(m_previous_point.y() - mousePos.y());
            if (mouseDir >= 0) {
                rightDirection = rightDirection || slopeTop;
            }
            if (mouseDir <= 0) {
                rightDirection = rightDirection || slopeBottom;
            }

            if (m_uni_dir_discarded_count >= m_uni_dir_fail_at_count && !rightDirection) {
                m_uni_dir_discarded_count = 0;
                return EventDiscardsSloppyState;
            }

            if (!rightDirection)
                m_uni_dir_discarded_count++;
            else
                m_uni_dir_discarded_count = 0;

        }

        return m_select_other_actions ? EventShouldBePropagated : EventIsProcessed;
    }